

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_transaction.cpp
# Opt level: O2

void cfd::capi::GetTxInfo
               (AbstractTransaction *tx,char **txid,char **wtxid,uint32_t *size,uint32_t *vsize,
               uint32_t *weight,uint32_t *version,uint32_t *locktime)

{
  uint32_t uVar1;
  char *pcVar2;
  string local_88;
  Txid local_68;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  
  if (txid != (char **)0x0) {
    core::AbstractTransaction::GetTxid(&local_68,tx);
    core::Txid::GetHex_abi_cxx11_(&local_88,&local_68);
    pcVar2 = CreateString(&local_88);
    *txid = pcVar2;
    std::__cxx11::string::~string((string *)&local_88);
    core::Txid::~Txid(&local_68);
  }
  if (wtxid != (char **)0x0) {
    core::AbstractTransaction::GetWitnessHash((ByteData256 *)&local_48,tx);
    core::Txid::Txid(&local_68,(ByteData256 *)&local_48);
    core::Txid::GetHex_abi_cxx11_(&local_88,&local_68);
    pcVar2 = CreateString(&local_88);
    *wtxid = pcVar2;
    std::__cxx11::string::~string((string *)&local_88);
    core::Txid::~Txid(&local_68);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_48);
  }
  if (size != (uint32_t *)0x0) {
    uVar1 = (*tx->_vptr_AbstractTransaction[4])(tx);
    *size = uVar1;
  }
  if (vsize != (uint32_t *)0x0) {
    uVar1 = (*tx->_vptr_AbstractTransaction[5])(tx);
    *vsize = uVar1;
  }
  if (weight != (uint32_t *)0x0) {
    uVar1 = (*tx->_vptr_AbstractTransaction[6])(tx);
    *weight = uVar1;
  }
  if (version != (uint32_t *)0x0) {
    uVar1 = core::AbstractTransaction::GetVersion(tx);
    *version = uVar1;
  }
  if (locktime != (uint32_t *)0x0) {
    uVar1 = core::AbstractTransaction::GetLockTime(tx);
    *locktime = uVar1;
  }
  return;
}

Assistant:

void GetTxInfo(
    AbstractTransaction* tx, char** txid, char** wtxid, uint32_t* size,
    uint32_t* vsize, uint32_t* weight, uint32_t* version, uint32_t* locktime) {
  if (txid != nullptr) {
    *txid = CreateString(tx->GetTxid().GetHex());
  }
  if (wtxid != nullptr) {
    *wtxid = CreateString(Txid(tx->GetWitnessHash()).GetHex());
  }
  if (size != nullptr) {
    *size = tx->GetTotalSize();
  }
  if (vsize != nullptr) {
    *vsize = tx->GetVsize();
  }
  if (weight != nullptr) {
    *weight = tx->GetWeight();
  }
  if (version != nullptr) {
    *version = tx->GetVersion();
  }
  if (locktime != nullptr) {
    *locktime = tx->GetLockTime();
  }
}